

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O1

void fl_rectbound(int x,int y,int w,int h,Fl_Color bgcolor)

{
  Fl_Color FVar1;
  ulong uVar2;
  
  uVar2 = 0x38;
  if (draw_it_active == 0) {
    FVar1 = fl_inactive(0x38);
    uVar2 = (ulong)FVar1;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h);
  if (draw_it_active == 0) {
    bgcolor = fl_inactive(bgcolor);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)bgcolor);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(x + 1),(ulong)(y + 1),(ulong)(w - 2),(ulong)(h - 2));
  return;
}

Assistant:

void fl_rectbound(int x, int y, int w, int h, Fl_Color bgcolor) {
  Fl::set_box_color(FL_BLACK);
  fl_rect(x, y, w, h);
  Fl::set_box_color(bgcolor);
  fl_rectf(x+1, y+1, w-2, h-2);
}